

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char *pcVar1;
  string *this_00;
  string ref;
  char local_a1;
  undefined1 local_a0 [48];
  string local_70;
  cmAlphaNum local_50;
  
  if (this->ReplaceAtSyntax == true) {
    pcVar1 = ExpandVariable(this,var);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    if (this->RemoveEmpty == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"",(allocator<char> *)&local_50);
      pcVar1 = AddString(this,(string *)local_a0);
      this_00 = (string *)local_a0;
      goto LAB_003bf725;
    }
  }
  local_a0._8_8_ = local_a0 + 0x10;
  local_a0._0_8_ = (pointer)0x1;
  local_a0[0x10] = '@';
  local_50.View_._M_len = strlen(var);
  local_a1 = '@';
  local_50.View_._M_str = var;
  cmStrCat<char>(&local_70,(cmAlphaNum *)local_a0,&local_50,&local_a1);
  pcVar1 = AddString(this,&local_70);
  this_00 = &local_70;
LAB_003bf725:
  std::__cxx11::string::~string((string *)this_00);
  return pcVar1;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = cmStrCat('@', var, '@');
  return this->AddString(ref);
}